

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
decrement_leaf_count
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          size_t leaf_size)

{
  __int_type _Var1;
  reference pvVar2;
  __int_type old_leaf_count;
  size_t leaf_size_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  decrease_memory_use(this,leaf_size);
  pvVar2 = std::array<std::atomic<unsigned_long>,_5UL>::operator[](&this->node_counts,0);
  LOCK();
  _Var1 = (pvVar2->super___atomic_base<unsigned_long>)._M_i;
  (pvVar2->super___atomic_base<unsigned_long>)._M_i =
       (pvVar2->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if (_Var1 == 0) {
    __assert_fail("old_leaf_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x325,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::decrement_leaf_count(std::size_t) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  return;
}

Assistant:

void decrement_leaf_count(std::size_t leaf_size) noexcept {
    decrease_memory_use(leaf_size);

    const auto old_leaf_count UNODB_DETAIL_USED_IN_DEBUG =
        node_counts[as_i<node_type::LEAF>].fetch_sub(1,
                                                     std::memory_order_relaxed);
    UNODB_DETAIL_ASSERT(old_leaf_count > 0);
  }